

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

CapTypes __thiscall ON_CurvePiping::CapType(ON_CurvePiping *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  CapTypes CVar2;
  ON_wString s;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,L"");
  ON_InternalXMLImpl::GetParameter(&local_200,this_00,L"cap-type",&local_108);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)&s);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  bVar1 = ::operator==(&s,L"flat");
  if (bVar1) {
    CVar2 = Flat;
  }
  else {
    bVar1 = ::operator==(&s,L"box");
    if (bVar1) {
      CVar2 = Box;
    }
    else {
      bVar1 = ::operator==(&s,L"dome");
      CVar2 = (uint)bVar1 + (uint)bVar1 * 2;
    }
  }
  ON_wString::~ON_wString(&s);
  return CVar2;
}

Assistant:

ON_CurvePiping::CapTypes ON_CurvePiping::CapType(void) const
{
  const ON_wString s = m_impl->GetParameter(ON_CURVE_PIPING_CAP_TYPE, L"").AsString();

  if (s == ON_CURVE_PIPING_FLAT) return ON_CurvePiping::CapTypes::Flat;
  if (s == ON_CURVE_PIPING_BOX)  return ON_CurvePiping::CapTypes::Box;
  if (s == ON_CURVE_PIPING_DOME) return ON_CurvePiping::CapTypes::Dome;

  return ON_CurvePiping::CapTypes::None;
}